

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void DoSetCVar(FBaseCVar *cvar,int value,bool is_string,bool force)

{
  int iVar1;
  ECVarType type;
  UCVarValue val;
  UCVarValue local_20;
  
  if (((cvar->Flags & 4) != 0) && (consoleplayer != Net_Arbitrator)) {
    return;
  }
  if (is_string) {
    local_20.String = FBehavior::StaticLookupString(value);
    type = CVAR_String;
  }
  else {
    iVar1 = (*cvar->_vptr_FBaseCVar[2])(cvar);
    if (iVar1 == 2) {
      local_20.Float = (float)value * 1.5258789e-05;
      type = CVAR_Float;
    }
    else {
      local_20.Int = value;
      type = CVAR_Int;
    }
  }
  if (force) {
    FBaseCVar::ForceSet(cvar,local_20,type,true);
    return;
  }
  FBaseCVar::SetGenericRep(cvar,local_20,type);
  return;
}

Assistant:

static void DoSetCVar(FBaseCVar *cvar, int value, bool is_string, bool force=false)
{
	UCVarValue val;
	ECVarType type;

	// For serverinfo variables, only the arbitrator should set it.
	// The actual change to this cvar will not show up until it's
	// been replicated to all peers.
	if ((cvar->GetFlags() & CVAR_SERVERINFO) && consoleplayer != Net_Arbitrator)
	{
		return;
	}
	if (is_string)
	{
		val.String = FBehavior::StaticLookupString(value);
		type = CVAR_String;
	}
	else if (cvar->GetRealType() == CVAR_Float)
	{
		val.Float = ACSToFloat(value);
		type = CVAR_Float;
	}
	else
	{
		val.Int = value;
		type = CVAR_Int;
	}
	if (force)
	{
		cvar->ForceSet(val, type, true);
	}
	else
	{
		cvar->SetGenericRep(val, type);
	}
}